

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

shared_ptr<httplib::Response> __thiscall
httplib::Client::Post(Client *this,char *path,Headers *headers,string *body,char *content_type)

{
  element_type *__buf;
  ulong uVar1;
  string *__n;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  int __flags;
  shared_ptr<httplib::Response> sVar2;
  undefined1 local_1d0 [8];
  shared_ptr<httplib::Response> res;
  undefined1 local_1a8 [8];
  Request req;
  char *content_type_local;
  string *body_local;
  Headers *headers_local;
  char *path_local;
  Client *this_local;
  
  __flags = (int)content_type;
  __n = body;
  Request::Request((Request *)local_1a8);
  std::__cxx11::string::operator=((string *)(req.version.field_2._M_local_buf + 8),"POST");
  std::
  multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::operator=((multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)((long)&req.path.field_2 + 8),
              (multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)body);
  std::__cxx11::string::operator=((string *)(req.target.field_2._M_local_buf + 8),(char *)headers);
  res.super___shared_ptr<httplib::Response,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       std::
       multimap<std::__cxx11::string,std::__cxx11::string,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
       ::emplace<char_const(&)[13],char_const*&>
                 ((multimap<std::__cxx11::string,std::__cxx11::string,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                   *)(req.path.field_2._M_local_buf + 8),(char (*) [13])"Content-Type",
                  (char **)&req.progress._M_invoker);
  std::__cxx11::string::operator=
            ((string *)&req.headers._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (string *)content_type);
  std::make_shared<httplib::Response>();
  __buf = std::__shared_ptr_access<httplib::Response,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator*((__shared_ptr_access<httplib::Response,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     *)local_1d0);
  uVar1 = send((Client *)path,(int)local_1a8,__buf,(size_t)__n,__flags);
  if ((uVar1 & 1) == 0) {
    std::shared_ptr<httplib::Response>::shared_ptr
              ((shared_ptr<httplib::Response> *)this,(nullptr_t)0x0);
  }
  else {
    std::shared_ptr<httplib::Response>::shared_ptr
              ((shared_ptr<httplib::Response> *)this,(shared_ptr<httplib::Response> *)local_1d0);
  }
  std::shared_ptr<httplib::Response>::~shared_ptr((shared_ptr<httplib::Response> *)local_1d0);
  Request::~Request((Request *)local_1a8);
  sVar2.super___shared_ptr<httplib::Response,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar2.super___shared_ptr<httplib::Response,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<httplib::Response>)
         sVar2.super___shared_ptr<httplib::Response,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

inline std::shared_ptr<Response> Client::Post(
    const char* path, const Headers& headers, const std::string& body, const char* content_type)
{
    Request req;
    req.method = "POST";
    req.headers = headers;
    req.path = path;

    req.headers.emplace("Content-Type", content_type);
    req.body = body;

    auto res = std::make_shared<Response>();

    return send(req, *res) ? res : nullptr;
}